

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O0

bool __thiscall
QOpenGLProgramBinaryCache::verifyHeader(QOpenGLProgramBinaryCache *this,QByteArray *buf)

{
  bool bVar1;
  quint32 qVar2;
  qsizetype qVar3;
  QByteArray *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  uchar *p;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_4;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  bool local_101;
  char local_100 [32];
  char local_e0 [32];
  char local_c0 [32];
  char local_a0 [32];
  char *local_80;
  char local_78 [32];
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar3 = QByteArray::size(in_RSI);
  if (qVar3 < 0x10) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcOpenGLProgramDiskCache();
    anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8);
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_18);
      if (!bVar1) break;
      anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x91034d);
      QMessageLogger::QMessageLogger
                (in_RDI,(char *)in_RSI,in_stack_fffffffffffffee4,(char *)in_stack_fffffffffffffed8,
                 (char *)0x910366);
      QMessageLogger::debug(local_78,"Cached size too small");
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
    local_101 = false;
  }
  else {
    local_80 = QByteArray::constData((QByteArray *)0x91039a);
    qVar2 = readUInt((uchar **)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    if (qVar2 == 0x5174) {
      qVar2 = readUInt((uchar **)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      if (qVar2 == 3) {
        qVar2 = readUInt((uchar **)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        if (qVar2 == 0x60a00) {
          qVar2 = readUInt((uchar **)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
          if (qVar2 == 8) {
            local_101 = true;
          }
          else {
            local_58 = &DAT_aaaaaaaaaaaaaaaa;
            local_50 = &DAT_aaaaaaaaaaaaaaaa;
            QtPrivateLogging::lcOpenGLProgramDiskCache();
            anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::
            QLoggingCategoryMacroHolder
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       in_stack_fffffffffffffed8);
            while( true ) {
              bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                ((QLoggingCategoryMacroHolder *)&local_58);
              if (!bVar1) break;
              anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                        ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x91060a);
              QMessageLogger::QMessageLogger
                        (in_RDI,(char *)in_RSI,in_stack_fffffffffffffee4,
                         (char *)in_stack_fffffffffffffed8,(char *)0x910620);
              QMessageLogger::debug(local_100,"Architecture does not match");
              local_50 = (undefined1 *)((ulong)local_50 & 0xffffffffffffff00);
            }
            local_101 = false;
          }
        }
        else {
          local_48 = &DAT_aaaaaaaaaaaaaaaa;
          local_40 = &DAT_aaaaaaaaaaaaaaaa;
          QtPrivateLogging::lcOpenGLProgramDiskCache();
          anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::
          QLoggingCategoryMacroHolder
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                     CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     in_stack_fffffffffffffed8);
          while( true ) {
            bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                              ((QLoggingCategoryMacroHolder *)&local_48);
            if (!bVar1) break;
            anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x910561);
            QMessageLogger::QMessageLogger
                      (in_RDI,(char *)in_RSI,in_stack_fffffffffffffee4,
                       (char *)in_stack_fffffffffffffed8,(char *)0x910577);
            QMessageLogger::debug(local_e0,"Qt version does not match");
            local_40 = (undefined1 *)((ulong)local_40 & 0xffffffffffffff00);
          }
          local_101 = false;
        }
      }
      else {
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        local_30 = &DAT_aaaaaaaaaaaaaaaa;
        QtPrivateLogging::lcOpenGLProgramDiskCache();
        anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                   CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   in_stack_fffffffffffffed8);
        while( true ) {
          bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                            ((QLoggingCategoryMacroHolder *)&local_38);
          if (!bVar1) break;
          anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x9104b9);
          QMessageLogger::QMessageLogger
                    (in_RDI,(char *)in_RSI,in_stack_fffffffffffffee4,
                     (char *)in_stack_fffffffffffffed8,(char *)0x9104cf);
          QMessageLogger::debug(local_c0,"Version does not match");
          local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
        }
        local_101 = false;
      }
    }
    else {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcOpenGLProgramDiskCache();
      anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffed8);
      while( true ) {
        bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_28);
        if (!bVar1) break;
        anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x91040d);
        QMessageLogger::QMessageLogger
                  (in_RDI,(char *)in_RSI,in_stack_fffffffffffffee4,(char *)in_stack_fffffffffffffed8
                   ,(char *)0x910426);
        QMessageLogger::debug(local_a0,"Magic does not match");
        local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
      }
      local_101 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_101;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGLProgramBinaryCache::verifyHeader(const QByteArray &buf) const
{
    if (buf.size() < BASE_HEADER_SIZE) {
        qCDebug(lcOpenGLProgramDiskCache, "Cached size too small");
        return false;
    }
    const uchar *p = reinterpret_cast<const uchar *>(buf.constData());
    if (readUInt(&p) != BINSHADER_MAGIC) {
        qCDebug(lcOpenGLProgramDiskCache, "Magic does not match");
        return false;
    }
    if (readUInt(&p) != BINSHADER_VERSION) {
        qCDebug(lcOpenGLProgramDiskCache, "Version does not match");
        return false;
    }
    if (readUInt(&p) != BINSHADER_QTVERSION) {
        qCDebug(lcOpenGLProgramDiskCache, "Qt version does not match");
        return false;
    }
    if (readUInt(&p) != sizeof(quintptr)) {
        qCDebug(lcOpenGLProgramDiskCache, "Architecture does not match");
        return false;
    }
    return true;
}